

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O1

void m68k_op_nbcd_8_al(void)

{
  uint addr_in;
  uint uVar1;
  uint uVar2;
  int iVar3;
  uint addr_in_00;
  uint value;
  
  my_fc_handler(m68ki_cpu.s_flag | 2);
  addr_in_00 = m68ki_cpu.pc & m68ki_cpu.address_mask;
  m68ki_cpu.pc = m68ki_cpu.pc + 4;
  my_fc_handler(m68ki_cpu.s_flag | 2);
  if (m68ki_cpu.pmmu_enabled != 0) {
    addr_in_00 = pmmu_translate_addr(addr_in_00);
  }
  addr_in = m68k_read_memory_32(addr_in_00 & m68ki_cpu.address_mask);
  my_fc_handler(m68ki_address_space | m68ki_cpu.s_flag);
  uVar1 = addr_in;
  if (m68ki_cpu.pmmu_enabled != 0) {
    uVar1 = pmmu_translate_addr(addr_in);
  }
  uVar1 = m68k_read_memory_8(uVar1 & m68ki_cpu.address_mask);
  iVar3 = ((int)(m68ki_cpu.x_flag << 0x17) >> 0x1f) - uVar1;
  value = 0x9a;
  uVar1 = iVar3 + 0x9a;
  uVar2 = uVar1 & 0xff;
  if (uVar2 == 0x9a) {
    m68ki_cpu.v_flag = 0;
    m68ki_cpu.c_flag = 0;
  }
  else {
    value = iVar3 + 0xaaU & 0xf0;
    if ((uVar1 & 0xf) != 10) {
      value = uVar2;
    }
    m68ki_cpu.v_flag = ~uVar2 & value;
    my_fc_handler(m68ki_cpu.s_flag | 1);
    if (m68ki_cpu.pmmu_enabled != 0) {
      addr_in = pmmu_translate_addr(addr_in);
    }
    m68k_write_memory_8(addr_in & m68ki_cpu.address_mask,value);
    m68ki_cpu.not_z_flag = m68ki_cpu.not_z_flag | value;
    m68ki_cpu.c_flag = 0x100;
  }
  m68ki_cpu.x_flag = m68ki_cpu.c_flag;
  m68ki_cpu.n_flag = value;
  return;
}

Assistant:

static void m68k_op_nbcd_8_al(void)
{
	uint ea = EA_AL_8();
	uint dst = m68ki_read_8(ea);
	uint res = MASK_OUT_ABOVE_8(0x9a - dst - XFLAG_AS_1());

	if(res != 0x9a)
	{
		FLAG_V = ~res; /* Undefined V behavior */

		if((res & 0x0f) == 0xa)
			res = (res & 0xf0) + 0x10;

		res = MASK_OUT_ABOVE_8(res);

		FLAG_V &= res; /* Undefined V behavior part II */

		m68ki_write_8(ea, MASK_OUT_ABOVE_8(res));

		FLAG_Z |= res;
		FLAG_C = CFLAG_SET;
		FLAG_X = XFLAG_SET;
	}
	else
	{
		FLAG_V = VFLAG_CLEAR;
		FLAG_C = CFLAG_CLEAR;
		FLAG_X = XFLAG_CLEAR;
	}
	FLAG_N = NFLAG_8(res);	/* Undefined N behavior */
}